

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hh
# Opt level: O1

bool __thiscall OB::Color::key(Color *this,string *k)

{
  char cVar1;
  pointer pcVar2;
  RGB rgb;
  RGB rgb_00;
  HSL hsl;
  HSL hsl_00;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  string *psVar7;
  bool bVar8;
  int iVar9;
  Type TVar10;
  long lVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  const_iterator cVar13;
  undefined8 uVar14;
  char *pcVar15;
  char *pcVar16;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  pointer unaff_R15;
  undefined1 auVar17 [16];
  double in_stack_fffffffffffffee0;
  string local_100;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_e0;
  string local_c0;
  string local_a0;
  undefined8 local_80;
  undefined8 uStack_78;
  double local_70;
  string local_68;
  string local_48;
  
  if (k->_M_string_length == 0) goto LAB_001145c0;
  iVar9 = std::__cxx11::string::compare((char *)k);
  if (iVar9 == 0) {
    std::__cxx11::string::_M_assign((string *)&this->_key);
    pcVar16 = (char *)(this->_value)._M_string_length;
    pcVar15 = "";
LAB_00114279:
    std::__cxx11::string::_M_replace((ulong)&this->_value,0,pcVar16,(ulong)pcVar15);
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)k);
    if (iVar9 == 0) {
      std::__cxx11::string::_M_assign((string *)&this->_key);
      pcVar16 = (char *)(this->_value)._M_string_length;
      pcVar15 = "\x1b[7m";
      goto LAB_00114279;
    }
    iVar9 = std::__cxx11::string::compare((char *)k);
    if (((iVar9 == 0) || (iVar9 = std::__cxx11::string::compare((char *)k), iVar9 == 0)) ||
       (iVar9 = std::__cxx11::string::compare((char *)k), iVar9 == 0)) {
      if (k->_M_string_length == 0) goto LAB_00114603;
      cVar1 = *(k->_M_dataplus)._M_p;
      if (cVar1 == 'r') {
        TVar10 = rainbow;
LAB_0011428f:
        this->_mode = TVar10;
      }
      else {
        if (cVar1 == 'p') {
          TVar10 = party;
          goto LAB_0011428f;
        }
        if (cVar1 == 'c') {
          TVar10 = candy;
          goto LAB_0011428f;
        }
      }
      std::__cxx11::string::_M_assign((string *)&this->_key);
      lVar11 = random(this);
      auVar17._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar17._0_8_ = lVar11;
      auVar17._12_4_ = 0x45300000;
      (this->_hsl).h =
           (auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
      bVar8 = this->_fg;
      if (bVar8 == true) {
        uVar3 = (this->_hsl).s;
        uVar4 = (this->_hsl).l;
        hsl.s = (double)uVar4;
        hsl.h = (double)uVar3;
        hsl.l = in_stack_fffffffffffffee0;
        hsl_to_rgb(this,hsl);
        rgb.g = (double)uStack_78;
        rgb.r = (double)local_80;
        rgb.b = local_70;
        rgb_to_hex_abi_cxx11_(&local_100,this,rgb);
        Term::ANSI_Escape_Codes::fg_true(&local_48,&local_100);
      }
      else {
        uVar5 = (this->_hsl).s;
        uVar6 = (this->_hsl).l;
        hsl_00.s = (double)uVar6;
        hsl_00.h = (double)uVar5;
        hsl_00.l = in_stack_fffffffffffffee0;
        hsl_to_rgb(this,hsl_00);
        rgb_00.g = (double)uStack_78;
        rgb_00.r = (double)local_80;
        rgb_00.b = local_70;
        rgb_to_hex_abi_cxx11_(&local_c0,this,rgb_00);
        Term::ANSI_Escape_Codes::bg_true(&local_48,&local_c0);
      }
      std::__cxx11::string::operator=((string *)&this->_value,(string *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (bVar8 == false) {
        psVar7 = &local_c0;
      }
      else {
        psVar7 = &local_100;
      }
      paVar12 = &psVar7->field_2;
      local_48._M_dataplus._M_p = (pointer)(&paVar12->_M_allocated_capacity)[-2];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar12) {
        local_48.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
LAB_001143ca:
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (k->_M_string_length == 0) {
LAB_00114603:
        uVar14 = std::__throw_out_of_range_fmt
                           ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0)
        ;
        if (local_68._M_dataplus._M_p != unaff_R15) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar14);
      }
      if (*(k->_M_dataplus)._M_p == '#') {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&stack0xfffffffffffffee0,
                   "^#[0-9a-fA-F]{3}(?:[0-9a-fA-F]{3})?$",0x10);
        bVar8 = String::assert_rx(k,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                    &stack0xfffffffffffffee0);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&stack0xfffffffffffffee0)
        ;
      }
      else {
        bVar8 = false;
      }
      if (bVar8 == false) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&local_e0,"^[0-9]{1,3}$",0x10);
        bVar8 = String::assert_rx(k,&local_e0);
        if ((bVar8) && (iVar9 = std::__cxx11::stoi(k,(size_t *)0x0,10), -1 < iVar9)) {
          iVar9 = std::__cxx11::stoi(k,(size_t *)0x0,10);
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&local_e0);
          if (0xff < iVar9) goto LAB_001144d7;
          std::__cxx11::string::_M_assign((string *)&this->_key);
          if (this->_fg == true) {
            Term::ANSI_Escape_Codes::fg_256(&local_48,k);
          }
          else {
            Term::ANSI_Escape_Codes::bg_256(&local_48,k);
          }
          std::__cxx11::string::operator=((string *)&this->_value,(string *)&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p == &local_48.field_2) goto LAB_001145bd;
          goto LAB_001143ca;
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_e0);
LAB_001144d7:
        cVar13 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&color_fg_abi_cxx11_._M_h,k);
        if (cVar13.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_001145c0;
        std::__cxx11::string::_M_assign((string *)&this->_key);
        this_00 = &color_bg_abi_cxx11_;
        if (this->_fg != false) {
          this_00 = &color_fg_abi_cxx11_;
        }
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::at(this_00,k);
        std::__cxx11::string::_M_assign((string *)&this->_value);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&this->_key);
        bVar8 = this->_fg;
        if (bVar8 == true) {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          pcVar2 = (k->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,pcVar2,pcVar2 + k->_M_string_length);
          Term::ANSI_Escape_Codes::fg_true(&local_48,&local_a0);
        }
        else {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          pcVar2 = (k->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,pcVar2,pcVar2 + k->_M_string_length);
          Term::ANSI_Escape_Codes::bg_true(&local_48,&local_68);
        }
        std::__cxx11::string::operator=((string *)&this->_value,(string *)&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        if (bVar8 == false) {
          psVar7 = &local_68;
        }
        else {
          psVar7 = &local_a0;
        }
        paVar12 = &psVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(&paVar12->_M_allocated_capacity)[-2] != paVar12) {
          operator_delete((undefined1 *)(&paVar12->_M_allocated_capacity)[-2],
                          paVar12->_M_allocated_capacity + 1);
        }
        hex_to_hsl((HSL *)&local_48,this,k);
        (this->_hsl).l = (double)local_48.field_2._M_allocated_capacity;
        (this->_hsl).h = (double)local_48._M_dataplus._M_p;
        (this->_hsl).s = (double)local_48._M_string_length;
      }
    }
  }
LAB_001145bd:
  this->_valid = true;
LAB_001145c0:
  return this->_valid;
}

Assistant:

bool key(std::string const& k)
  {
    if (! k.empty())
    {
      if (k == "clear")
      {
        // clear
        _key = k;
        _value = "";
        _valid = true;
      }
      else if (k == "reverse")
      {
        // reverse
        _key = k;
        _value = "\x1b[7m";
        _valid = true;
      }
      else if (k == "rainbow" || k == "candy" || k == "party")
      {
        switch(k.at(0))
        {
          case 'r':
          {
            _mode = Mode::rainbow;

            break;
          }

          case 'c':
          {
            _mode = Mode::candy;

            break;
          }

          case 'p':
          {
            _mode = Mode::party;

            break;
          }

          default:
          {
            break;
          }
        }

        _key = k;
        _hsl.h = random(0, 100);
        _value = _fg ? aec::fg_true(hsl_to_hex(_hsl)) :
          aec::bg_true(hsl_to_hex(_hsl));
        _valid = true;
      }
      else
      {
        // 21-bit color
        if (k.at(0) == '#' && OB::String::assert_rx(k,
          std::regex("^#[0-9a-fA-F]{3}(?:[0-9a-fA-F]{3})?$")))
        {
          _key = k;
          _value = _fg ? aec::fg_true(k) : aec::bg_true(k);
          _hsl = hex_to_hsl(k);
          _valid = true;
        }

        // 8-bit color
        else if (OB::String::assert_rx(k, std::regex("^[0-9]{1,3}$")) &&
          std::stoi(k) >= 0 && std::stoi(k) <= 255)
        {
          _key = k;
          _value = _fg ? aec::fg_256(k) : aec::bg_256(k);
          _valid = true;
        }

        // 4-bit color
        else if (color_fg.find(k) != color_fg.end())
        {
          _key = k;

          if (_fg)
          {
            _value = color_fg.at(k);
          }
          else
          {
            _value = color_bg.at(k);
          }

          _valid = true;
        }
      }
    }

    return _valid;
  }